

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_send_op_base<std::array<asio::const_buffer,_2UL>_>::do_perform
                 (reactor_op *base)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  size_t *in_RDI;
  error_code *unaff_retaddr;
  int in_stack_0000000c;
  size_t in_stack_00000010;
  bufs_type bufs;
  status result;
  reactive_socket_send_op_base<std::array<asio::const_buffer,_2UL>_> *o;
  array<asio::const_buffer,_2UL> *in_stack_ffffffffffffffd8;
  buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_>
  *in_stack_ffffffffffffffe0;
  status local_14;
  size_t *bytes_transferred;
  
  bytes_transferred = in_RDI;
  buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_>::
  buffer_sequence_adapter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_>::buffers
            ((buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_> *)
             &stack0xffffffffffffffc0);
  buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_>::count
            ((buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_> *)
             &stack0xffffffffffffffc0);
  bVar2 = socket_ops::non_blocking_send
                    ((socket_type)bufs.buffers_[0].iov_len,(buf *)bufs.buffers_[0].iov_base,
                     in_stack_00000010,in_stack_0000000c,unaff_retaddr,bytes_transferred);
  local_14 = (status)bVar2;
  if (((local_14 == done) && ((*(byte *)((long)in_RDI + 0x44) & 0x10) != 0)) &&
     (uVar1 = in_RDI[6],
     sVar3 = buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_>::
             total_size((buffer_sequence_adapter<asio::const_buffer,_std::array<asio::const_buffer,_2UL>_>
                         *)&stack0xffffffffffffffc0), uVar1 < sVar3)) {
    local_14 = done_and_exhausted;
  }
  return local_14;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_send1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs_type::first(o->buffers_).size())
            result = done_and_exhausted;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_send(o->socket_,
            bufs.buffers(), bufs.count(), o->flags_,
            o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs.total_size())
            result = done_and_exhausted;
    }

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }